

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScopedPrinter.h
# Opt level: O1

void __thiscall
llvm::DelimitedScope<'{',_'}'>::DelimitedScope
          (DelimitedScope<___,____> *this,ScopedPrinter *W,StringRef N)

{
  char *pcVar1;
  raw_ostream *prVar2;
  char *__n;
  void *__buf;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf_00;
  
  this->W = W;
  __n = (char *)N.Length;
  ScopedPrinter::printIndent(W);
  raw_ostream::operator<<(W->OS,N);
  __buf_00 = __buf;
  if ((char *)N.Length != (char *)0x0) {
    prVar2 = W->OS;
    pcVar1 = prVar2->OutBufCur;
    if (pcVar1 < prVar2->OutBufEnd) {
      __n = pcVar1 + 1;
      prVar2->OutBufCur = __n;
      *pcVar1 = ' ';
    }
    else {
      raw_ostream::write(prVar2,0x20,__buf,(size_t)__n);
      __buf_00 = extraout_RDX;
    }
  }
  prVar2 = W->OS;
  pcVar1 = prVar2->OutBufCur;
  if (pcVar1 < prVar2->OutBufEnd) {
    __n = pcVar1 + 1;
    prVar2->OutBufCur = __n;
    *pcVar1 = '{';
  }
  else {
    prVar2 = (raw_ostream *)raw_ostream::write(prVar2,0x7b,__buf_00,(size_t)__n);
    __buf_00 = extraout_RDX_00;
  }
  pcVar1 = prVar2->OutBufCur;
  if (pcVar1 < prVar2->OutBufEnd) {
    prVar2->OutBufCur = pcVar1 + 1;
    *pcVar1 = '\n';
  }
  else {
    raw_ostream::write(prVar2,10,__buf_00,(size_t)__n);
  }
  W->IndentLevel = W->IndentLevel + 1;
  return;
}

Assistant:

DelimitedScope(ScopedPrinter &W, StringRef N) : W(W) {
    W.startLine() << N;
    if (!N.empty())
      W.getOStream() << ' ';
    W.getOStream() << Open << '\n';
    W.indent();
  }